

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrNewSceneComputeInfoMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  XrSceneComputeFeatureMSFT XVar4;
  XrSceneComputeConsistencyMSFT XVar5;
  pointer pcVar6;
  PFN_xrStructureTypeToString p_Var7;
  void *value_00;
  XrStructureType __val;
  XrSceneComputeFeatureMSFT __val_00;
  XrSceneComputeConsistencyMSFT __val_01;
  string *psVar8;
  XrNewSceneComputeInfoMSFT *pXVar9;
  uint uVar10;
  char cVar11;
  bool bVar12;
  char cVar13;
  uint uVar14;
  char *pcVar15;
  XrInstance pXVar16;
  invalid_argument *piVar17;
  long lVar18;
  ulong uVar19;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  ulong uVar20;
  uint uVar21;
  string bounds_prefix;
  string type_prefix;
  string consistency_prefix;
  string requestedfeaturecount_prefix;
  string next_prefix;
  string requestedfeatures_prefix;
  ostringstream oss_requestedFeatureCount;
  ostringstream oss_requestedFeatures_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string *local_3f8;
  XrNewSceneComputeInfoMSFT *local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  string local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  PFN_xrGetReferenceSpaceBoundsRect local_308;
  PFN_xrCreateActionSpace p_Stack_300;
  PFN_xrLocateSpace local_2f8;
  PFN_xrDestroySpace p_Stack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  paVar1 = &local_328.field_2;
  local_328._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar15 = local_328._M_dataplus._M_p + local_328._M_string_length + -1;
  lVar18 = 0;
  do {
    bVar2 = local_1a8[lVar18];
    *pcVar15 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar15[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar18 = lVar18 + 1;
    pcVar15 = pcVar15 + -2;
  } while (lVar18 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar1) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_438);
  local_3f8 = prefix;
  local_3f0 = value;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar21 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar20 = (ulong)__val;
      uVar10 = 4;
      do {
        uVar21 = uVar10;
        uVar14 = (uint)uVar20;
        if (uVar14 < 100) {
          uVar21 = uVar21 - 2;
          goto LAB_001840d0;
        }
        if (uVar14 < 1000) {
          uVar21 = uVar21 - 1;
          goto LAB_001840d0;
        }
        if (uVar14 < 10000) goto LAB_001840d0;
        uVar20 = uVar20 / 10000;
        uVar10 = uVar21 + 4;
      } while (99999 < uVar14);
      uVar21 = uVar21 + 1;
    }
LAB_001840d0:
    local_328._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)uVar21 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar3 >> 0x1f),uVar21,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_438,&local_328);
    value = local_3f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = (PFN_xrLocateSpace)0x0;
    p_Stack_2f0 = (PFN_xrDestroySpace)0x0;
    local_308 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    p_Stack_300 = (PFN_xrCreateActionSpace)0x0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var7 = gen_dispatch_table->StructureTypeToString;
    pXVar16 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var7)(pXVar16,value->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_438,(char (*) [64])&local_328);
  }
  local_3c8 = local_3b8;
  pcVar6 = (local_3f8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,pcVar6,pcVar6 + local_3f8->_M_string_length);
  std::__cxx11::string::append((char *)&local_3c8);
  value_00 = value->next;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_3c8,local_3c0 + (long)local_3c8);
  bVar12 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (!bVar12) {
    piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar17,"Invalid Operation");
    __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  pcVar6 = (local_3f8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,pcVar6,pcVar6 + local_3f8->_M_string_length);
  std::__cxx11::string::append((char *)&local_3e8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"0x",2);
  *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_3e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrNewSceneComputeInfoMSFT *)local_1a8._0_8_ !=
      (XrNewSceneComputeInfoMSFT *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  pcVar6 = (local_3f8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,pcVar6,pcVar6 + local_3f8->_M_string_length);
  std::__cxx11::string::append((char *)&local_3a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + (long)*(XrSceneOrientedBoxBoundMSFT **)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 +
                (long)*(XrSceneOrientedBoxBoundMSFT **)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[33],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [33])"const XrSceneComputeFeatureMSFT*",&local_3a8,&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (value->requestedFeatureCount != 0) {
    paVar1 = &local_458.field_2;
    uVar20 = 0;
    do {
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_418,local_3a8._M_dataplus._M_p,
                 local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
      std::__cxx11::string::append((char *)&local_418);
      cVar13 = '\x01';
      if (9 < uVar20) {
        uVar19 = uVar20;
        cVar11 = '\x04';
        do {
          cVar13 = cVar11;
          uVar21 = (uint)uVar19;
          if (uVar21 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0018442a;
          }
          if (uVar21 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0018442a;
          }
          if (uVar21 < 10000) goto LAB_0018442a;
          uVar19 = (uVar19 & 0xffffffff) / 10000;
          cVar11 = cVar13 + '\x04';
        } while (99999 < uVar21);
        cVar13 = cVar13 + '\x01';
      }
LAB_0018442a:
      local_458._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_458,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_458._M_dataplus._M_p,(uint)local_458._M_string_length,(uint)uVar20);
      std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_458._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar1) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_418);
      XVar4 = value->requestedFeatures[uVar20];
      __val_00 = -XVar4;
      if (0 < (int)XVar4) {
        __val_00 = XVar4;
      }
      uVar21 = 1;
      if (9 < __val_00) {
        uVar19 = (ulong)__val_00;
        uVar10 = 4;
        do {
          uVar21 = uVar10;
          uVar14 = (uint)uVar19;
          if (uVar14 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_001844e7;
          }
          if (uVar14 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_001844e7;
          }
          if (uVar14 < 10000) goto LAB_001844e7;
          uVar19 = uVar19 / 10000;
          uVar10 = uVar21 + 4;
        } while (99999 < uVar14);
        uVar21 = uVar21 + 1;
      }
LAB_001844e7:
      local_458._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct
                ((ulong)&local_458,(char)uVar21 - (char)((int)XVar4 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_458._M_dataplus._M_p + (XVar4 >> 0x1f),uVar21,__val_00);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[33],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [33])"const XrSceneComputeFeatureMSFT*",&local_418,&local_458
                );
      value = local_3f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar1) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < value->requestedFeatureCount);
  }
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  pcVar6 = (local_3f8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,pcVar6,pcVar6 + local_3f8->_M_string_length);
  std::__cxx11::string::append((char *)&local_418);
  XVar5 = value->consistency;
  __val_01 = -XVar5;
  if (0 < (int)XVar5) {
    __val_01 = XVar5;
  }
  uVar21 = 1;
  if (9 < __val_01) {
    uVar20 = (ulong)__val_01;
    uVar10 = 4;
    do {
      uVar21 = uVar10;
      uVar14 = (uint)uVar20;
      if (uVar14 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00184617;
      }
      if (uVar14 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00184617;
      }
      if (uVar14 < 10000) goto LAB_00184617;
      uVar20 = uVar20 / 10000;
      uVar10 = uVar21 + 4;
    } while (99999 < uVar14);
    uVar21 = uVar21 + 1;
  }
LAB_00184617:
  paVar1 = &local_458.field_2;
  local_458._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_458,(char)uVar21 - (char)((int)XVar5 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_458._M_dataplus._M_p + (XVar5 >> 0x1f),uVar21,__val_01);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[30],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [30])"XrSceneComputeConsistencyMSFT",&local_418,&local_458);
  pXVar9 = local_3f0;
  psVar8 = local_3f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != paVar1) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (psVar8->_M_dataplus)._M_p;
  local_458._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_458,pcVar6,pcVar6 + psVar8->_M_string_length);
  std::__cxx11::string::append((char *)&local_458);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_458._M_dataplus._M_p,
             local_458._M_dataplus._M_p +
             CONCAT44(local_458._M_string_length._4_4_,(uint)local_458._M_string_length));
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_388;
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)gen_dispatch_table_00,"XrSceneBoundsMSFT","");
  bVar12 = ApiDumpOutputXrStruct
                     (gen_dispatch_table_00,&pXVar9->bounds,&local_368,(string *)local_388,false,
                      contents);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (bVar12) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != paVar1) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
    std::ios_base::~ios_base(local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if (local_3c8 != local_3b8) {
      operator_delete(local_3c8,local_3b8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar17,"Invalid Operation");
  __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrNewSceneComputeInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string requestedfeaturecount_prefix = prefix;
        requestedfeaturecount_prefix += "requestedFeatureCount";
        std::ostringstream oss_requestedFeatureCount;
        oss_requestedFeatureCount << "0x" << std::hex << (value->requestedFeatureCount);
        contents.emplace_back("uint32_t", requestedfeaturecount_prefix, oss_requestedFeatureCount.str());
        std::string requestedfeatures_prefix = prefix;
        requestedfeatures_prefix += "requestedFeatures";
        std::ostringstream oss_requestedFeatures_array;
        oss_requestedFeatures_array << std::hex << reinterpret_cast<const void*>(value->requestedFeatures);
        contents.emplace_back("const XrSceneComputeFeatureMSFT*", requestedfeatures_prefix, oss_requestedFeatures_array.str());
        for (uint32_t value_requestedfeatures_inc = 0; value_requestedfeatures_inc < value->requestedFeatureCount; ++value_requestedfeatures_inc) {
            std::string requestedfeatures_array_prefix = requestedfeatures_prefix;
            requestedfeatures_array_prefix += "[";
            requestedfeatures_array_prefix += std::to_string(value_requestedfeatures_inc);
            requestedfeatures_array_prefix += "]";
            contents.emplace_back("const XrSceneComputeFeatureMSFT*", requestedfeatures_array_prefix, std::to_string(value->requestedFeatures[value_requestedfeatures_inc]));
        }
        std::string consistency_prefix = prefix;
        consistency_prefix += "consistency";
        contents.emplace_back("XrSceneComputeConsistencyMSFT", consistency_prefix, std::to_string(value->consistency));
        std::string bounds_prefix = prefix;
        bounds_prefix += "bounds";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->bounds, bounds_prefix, "XrSceneBoundsMSFT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}